

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O1

int main(int argc,char **argv)

{
  VkPhysicalDevice pVVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  uint uVar9;
  uint uVar10;
  VkResult VVar11;
  GLFWwindow *handle;
  GLubyte *pGVar12;
  char **ppcVar13;
  VkPhysicalDevice *__ptr;
  VkLayerProperties *__ptr_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int minor_00;
  ulong uVar14;
  char *pcVar15;
  VkExtensionProperties *pVVar16;
  ulong uVar17;
  char *pcVar18;
  undefined8 uVar19;
  GLint auxbuffers;
  GLint accumalphabits;
  uint32_t pd_count;
  uint32_t re_count;
  GLint stencilbits;
  GLint depthbits;
  GLint alphabits;
  GLint bluebits;
  GLint greenbits;
  GLint redbits;
  int revision;
  int minor;
  int major;
  option options [31];
  uint local_81c;
  undefined8 local_818;
  VkExtensionProperties *local_810;
  undefined8 local_808;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  GLint local_7f0;
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  uint local_7e0;
  uint local_7dc;
  VkPhysicalDevice *local_7d8;
  char *local_7d0;
  VkApplicationInfo local_7c8;
  VkInstanceCreateInfo local_798;
  VkPhysicalDeviceProperties local_750;
  option local_418 [31];
  
  memcpy(local_418,&PTR_anon_var_dwarf_2f_001601a0,0x3e0);
  glfwGetVersion((int *)&local_750,(int *)&local_798,(int *)&local_7c8);
  uVar4 = local_750.apiVersion;
  if (local_750.apiVersion == 3) {
    pcVar15 = "*** WARNING: GLFW version mismatch! ***";
    if ((local_798.sType != VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO) ||
       (local_7c8.sType != VK_STRUCTURE_TYPE_SUBMIT_INFO)) goto LAB_00118c22;
  }
  else {
    pcVar15 = "*** ERROR: GLFW major version mismatch! ***";
LAB_00118c22:
    puts(pcVar15);
  }
  if (uVar4 == 3) {
    glfwSetErrorCallback(error_callback);
    glfwInitHint(0x51002,0);
    iVar6 = glfwInit();
    if (iVar6 != 0) {
      local_818 = 0;
      bVar5 = false;
switchD_00118c9e_caseD_6:
      bVar2 = bVar5;
      iVar6 = getopt_long(argc,argv,"a:b:c:dfhlm:n:p:s:v",local_418,(int *)0x0);
      pcVar15 = optarg;
      bVar5 = true;
      switch(iVar6) {
      case 0:
        goto switchD_00118c9e_caseD_0;
      case 1:
        goto switchD_00118c9e_caseD_1;
      case 2:
        goto switchD_00118c9e_caseD_2;
      case 3:
        goto switchD_00118c9e_caseD_3;
      case 4:
        goto switchD_00118c9e_caseD_4;
      case 5:
        goto switchD_00118c9e_caseD_5;
      case 6:
        goto switchD_00118c9e_caseD_6;
      case 7:
        local_818 = 1;
        bVar5 = bVar2;
        goto switchD_00118c9e_caseD_6;
      case 8:
        goto switchD_00118c9e_caseD_8;
      case 9:
        goto switchD_00118c9e_caseD_9;
      case 10:
        goto switchD_00118c9e_caseD_a;
      case 0xb:
        goto switchD_00118c9e_caseD_b;
      case 0xc:
        goto switchD_00118c9e_caseD_c;
      case 0xd:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21001;
LAB_001191c6:
          iVar7 = -1;
        }
        else {
          iVar7 = atoi(pcVar15);
          iVar6 = 0x21001;
        }
        break;
      case 0xe:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21002;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21002;
        break;
      case 0xf:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21003;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21003;
        break;
      case 0x10:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21004;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21004;
        break;
      case 0x11:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21005;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21005;
        break;
      case 0x12:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21006;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21006;
        break;
      case 0x13:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21007;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21007;
        break;
      case 0x14:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21008;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21008;
        break;
      case 0x15:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x21009;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x21009;
        break;
      case 0x16:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x2100a;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x2100a;
        break;
      case 0x17:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x2100b;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x2100b;
        break;
      case 0x18:
        iVar6 = strcmp(optarg,"-");
        if (iVar6 == 0) {
          iVar6 = 0x2100d;
          goto LAB_001191c6;
        }
        iVar7 = atoi(pcVar15);
        iVar6 = 0x2100d;
        break;
      case 0x19:
        iVar6 = 0x2100c;
        goto LAB_00118f49;
      case 0x1a:
        iVar6 = 0x2100e;
        goto LAB_00118f49;
      case 0x1b:
        iVar6 = 0x21010;
        iVar7 = 0;
        break;
      case 0x1c:
        iVar6 = 0x2200a;
        goto LAB_00118f49;
      case 0x1d:
        iVar6 = 0x23003;
        goto LAB_00118f49;
      case -1:
        goto switchD_00118c9e_caseD_ffffffff;
      default:
        goto code_r0x00118cbb;
      }
      goto LAB_001191cb;
    }
  }
LAB_001191dd:
  exit(1);
code_r0x00118cbb:
  bVar5 = true;
  switch(iVar6) {
  case 0x61:
switchD_00118c9e_caseD_0:
    iVar6 = strcasecmp(optarg,"gl");
    if (iVar6 == 0) {
      iVar6 = 0x22001;
      iVar7 = 0x30001;
    }
    else {
      iVar6 = strcasecmp(pcVar15,"es");
      if (iVar6 != 0) goto switchD_00118cce_caseD_65;
      iVar6 = 0x22001;
      iVar7 = 0x30002;
    }
    break;
  case 0x62:
switchD_00118c9e_caseD_2:
    iVar6 = strcasecmp(optarg,"none");
    if (iVar6 == 0) {
      iVar6 = 0x22009;
      iVar7 = 0x35002;
    }
    else {
      iVar6 = strcasecmp(pcVar15,"flush");
      if (iVar6 != 0) goto switchD_00118cce_caseD_65;
      iVar6 = 0x22009;
      iVar7 = 0x35001;
    }
    break;
  case 99:
switchD_00118c9e_caseD_1:
    iVar6 = strcasecmp(optarg,"native");
    if (iVar6 == 0) {
      iVar6 = 0x2200b;
      iVar7 = 0x36001;
    }
    else {
      iVar6 = strcasecmp(pcVar15,"egl");
      if (iVar6 == 0) {
        iVar6 = 0x2200b;
        iVar7 = 0x36002;
      }
      else {
        iVar6 = strcasecmp(pcVar15,"osmesa");
        if (iVar6 != 0) goto switchD_00118cce_caseD_65;
        iVar6 = 0x2200b;
        iVar7 = 0x36003;
      }
    }
    break;
  case 100:
switchD_00118c9e_caseD_3:
    iVar6 = 0x22007;
    goto LAB_00118f49;
  default:
switchD_00118cce_caseD_65:
    usage();
    goto LAB_001191dd;
  case 0x66:
switchD_00118c9e_caseD_4:
    iVar6 = 0x22006;
LAB_00118f49:
    iVar7 = 1;
    break;
  case 0x68:
switchD_00118c9e_caseD_5:
    usage();
    goto LAB_001191f3;
  case 0x6c:
    goto switchD_00118c9e_caseD_6;
  case 0x6d:
switchD_00118c9e_caseD_8:
    iVar7 = atoi(optarg);
    iVar6 = 0x22002;
    break;
  case 0x6e:
switchD_00118c9e_caseD_9:
    iVar7 = atoi(optarg);
    iVar6 = 0x22003;
    break;
  case 0x70:
switchD_00118c9e_caseD_a:
    iVar6 = strcasecmp(optarg,"core");
    if (iVar6 == 0) {
      iVar6 = 0x22008;
      iVar7 = 0x32001;
    }
    else {
      iVar6 = strcasecmp(pcVar15,"compat");
      if (iVar6 != 0) goto switchD_00118cce_caseD_65;
      iVar6 = 0x22008;
      iVar7 = 0x32002;
    }
    break;
  case 0x73:
switchD_00118c9e_caseD_b:
    iVar6 = strcasecmp(optarg,"none");
    if (iVar6 == 0) {
      iVar6 = 0x22005;
      iVar7 = 0x31001;
    }
    else {
      iVar6 = strcasecmp(pcVar15,"lose");
      if (iVar6 != 0) goto switchD_00118cce_caseD_65;
      iVar6 = 0x22005;
      iVar7 = 0x31002;
    }
    break;
  case 0x76:
switchD_00118c9e_caseD_c:
    print_version();
    goto LAB_001191f3;
  }
LAB_001191cb:
  glfwWindowHint(iVar6,iVar7);
  bVar5 = bVar2;
  goto switchD_00118c9e_caseD_6;
switchD_00118c9e_caseD_ffffffff:
  print_version();
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(200,200,"Version",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    gladLoadGL(glfwGetProcAddress);
    GVar8 = (*glad_glGetError)();
    if (GVar8 != 0) {
      printf("*** OpenGL error after make current: 0x%08x ***\n",(ulong)GVar8);
    }
    iVar6 = glfwGetWindowAttrib(handle,0x22001);
    uVar9 = glfwGetWindowAttrib(handle,0x22002);
    uVar10 = glfwGetWindowAttrib(handle,0x22003);
    iVar7 = glfwGetWindowAttrib(handle,0x22004);
    local_810 = (VkExtensionProperties *)CONCAT44(local_810._4_4_,iVar7);
    iVar7 = glfwGetWindowAttrib(handle,0x22008);
    local_7d8 = (VkPhysicalDevice *)CONCAT44(local_7d8._4_4_,iVar7);
    pcVar15 = "Unknown API";
    if (iVar6 == 0x30002) {
      pcVar15 = "OpenGL ES";
    }
    pcVar18 = "OpenGL";
    if (iVar6 != 0x30001) {
      pcVar18 = pcVar15;
    }
    pGVar12 = (*glad_glGetString)(0x1f02);
    printf("%s context version string: \"%s\"\n",pcVar18,pGVar12);
    local_7f4 = uVar10;
    local_7d0 = pcVar18;
    printf("%s context version parsed by GLFW: %u.%u.%u\n",pcVar18,(ulong)uVar9,(ulong)uVar10,
           (ulong)local_810 & 0xffffffff);
    local_810 = (VkExtensionProperties *)CONCAT44(local_810._4_4_,iVar6);
    iVar7 = (int)local_818;
    if (iVar6 == 0x30001) {
      if (2 < (int)uVar9) {
        (*glad_glGetIntegerv)(0x821e,(GLint *)&local_750);
        printf("%s context flags (0x%08x):","OpenGL",(ulong)local_750.apiVersion);
        if ((local_750.apiVersion & 1) != 0) {
          printf(" forward-compatible");
        }
        if ((local_750.apiVersion & 2) != 0) {
          printf(" debug");
        }
        iVar7 = (int)local_818;
        if ((local_750.apiVersion & 4) != 0) {
          printf(" robustness");
        }
        if ((local_750.apiVersion & 8) != 0) {
          printf(" no-error");
        }
        putchar(10);
        printf("%s context flags parsed by GLFW:","OpenGL");
        iVar6 = glfwGetWindowAttrib(handle,0x22006);
        if (iVar6 != 0) {
          printf(" forward-compatible");
        }
        iVar6 = glfwGetWindowAttrib(handle,0x22007);
        if (iVar6 != 0) {
          printf(" debug");
        }
        iVar6 = glfwGetWindowAttrib(handle,0x22005);
        if (iVar6 == 0x31002) {
          printf(" robustness");
        }
        iVar6 = glfwGetWindowAttrib(handle,0x2200a);
        if (iVar6 != 0) {
          printf(" no-error");
        }
        putchar(10);
      }
      if ((3 < (int)uVar9) || (1 < (int)local_7f4 && uVar9 == 3)) {
        (*glad_glGetIntegerv)(0x9126,(GLint *)&local_750);
        pcVar18 = "unknown";
        pcVar15 = "core";
        if ((local_750.apiVersion & 1) == 0) {
          pcVar15 = "unknown";
        }
        if ((local_750.apiVersion & 2) != 0) {
          pcVar15 = "compat";
        }
        printf("%s profile mask (0x%08x): %s\n","OpenGL",(ulong)local_750.apiVersion,pcVar15);
        if ((int)local_7d8 == 0x32001) {
          pcVar18 = "core";
        }
        if ((int)local_7d8 == 0x32002) {
          pcVar18 = "compat";
        }
        iVar7 = (int)local_818;
        printf("%s profile mask parsed by GLFW: %s\n","OpenGL",pcVar18);
      }
      if (GLAD_GL_ARB_robustness != 0) {
        iVar6 = glfwGetWindowAttrib(handle,0x22005);
        (*glad_glGetIntegerv)(0x8256,(GLint *)&local_750);
        pcVar18 = "unknown";
        pcVar15 = "unknown";
        if (local_750.apiVersion == 0x8261) {
          pcVar15 = "none";
        }
        if (local_750.apiVersion == 0x8252) {
          pcVar15 = "lose";
        }
        printf("%s robustness strategy (0x%08x): %s\n","OpenGL",(ulong)local_750.apiVersion,pcVar15)
        ;
        if (iVar6 == 0x31001) {
          pcVar18 = "none";
        }
        iVar7 = (int)local_818;
        if (iVar6 == 0x31002) {
          pcVar18 = "lose";
        }
        printf("%s robustness strategy parsed by GLFW: %s\n","OpenGL",pcVar18);
      }
    }
    pGVar12 = (*glad_glGetString)(0x1f01);
    pcVar15 = local_7d0;
    printf("%s context renderer string: \"%s\"\n",local_7d0,pGVar12);
    pGVar12 = (*glad_glGetString)(0x1f00);
    printf("%s context vendor string: \"%s\"\n",pcVar15,pGVar12);
    if (1 < (int)uVar9) {
      pGVar12 = (*glad_glGetString)(0x8b8c);
      printf("%s context shading language version: \"%s\"\n",pcVar15,pGVar12);
    }
    iVar6 = (int)local_810;
    printf("%s framebuffer:\n",pcVar15);
    iVar3 = (int)local_7d8;
    if ((int)local_7d8 == 0x32001 && iVar6 == 0x30001) {
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8212,(GLint *)&local_7dc);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8213,(GLint *)&local_7e0);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8214,(GLint *)&local_7e4);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8215,(GLint *)&local_7e8);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x1801,0x8216,(GLint *)&local_7ec);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x1802,0x8217,&local_7f0);
    }
    else {
      (*glad_glGetIntegerv)(0xd52,(GLint *)&local_7dc);
      (*glad_glGetIntegerv)(0xd53,(GLint *)&local_7e0);
      (*glad_glGetIntegerv)(0xd54,(GLint *)&local_7e4);
      (*glad_glGetIntegerv)(0xd55,(GLint *)&local_7e8);
      (*glad_glGetIntegerv)(0xd56,(GLint *)&local_7ec);
      (*glad_glGetIntegerv)(0xd57,&local_7f0);
    }
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,uVar9);
    printf(" red: %u green: %u blue: %u alpha: %u depth: %u stencil: %u\n",(ulong)local_7dc,
           (ulong)local_7e0,(ulong)local_7e4,(ulong)local_7e8,(ulong)local_7ec,local_7f0);
    minor_00 = extraout_EDX;
    if ((2 < (int)local_7f4 || (iVar6 == 0x30002 || 1 < (int)uVar9)) || GLAD_GL_ARB_multisample != 0
       ) {
      (*glad_glGetIntegerv)(0x80a9,(GLint *)&local_750);
      (*glad_glGetIntegerv)(0x80a8,(GLint *)&local_798);
      iVar6 = (int)local_810;
      iVar7 = (int)local_818;
      printf(" samples: %u sample buffers: %u\n",(ulong)local_750.apiVersion,
             local_798._0_8_ & 0xffffffff);
      minor_00 = extraout_EDX_00;
    }
    if (iVar3 != 0x32001 && iVar6 == 0x30001) {
      (*glad_glGetIntegerv)(0xd58,(GLint *)&local_750);
      (*glad_glGetIntegerv)(0xd59,(GLint *)&local_798);
      (*glad_glGetIntegerv)(0xd5a,(GLint *)&local_7c8);
      (*glad_glGetIntegerv)(0xd5b,(GLint *)&local_808);
      (*glad_glGetIntegerv)(0xc00,(GLint *)&local_81c);
      iVar7 = (int)local_818;
      iVar6 = (int)local_810;
      printf(" accum red: %u accum green: %u accum blue: %u accum alpha: %u aux buffers: %u\n",
             (ulong)local_750.apiVersion,local_798._0_8_ & 0xffffffff,local_7c8._0_8_ & 0xffffffff,
             (ulong)(uint)local_808,(ulong)local_81c);
      minor_00 = extraout_EDX_01;
    }
    if (bVar2) {
      list_context_extensions(iVar6,(int)local_7d0,minor_00);
    }
    iVar6 = glfwVulkanSupported();
    pcVar15 = "available";
    if (iVar6 == 0) {
      pcVar15 = "missing";
    }
    printf("Vulkan loader: %s\n",pcVar15);
    iVar6 = glfwVulkanSupported();
    if (iVar6 == 0) {
LAB_001198e3:
      glfwTerminate();
LAB_001191f3:
      exit(0);
    }
    local_7c8.pEngineName = (char *)0x0;
    local_7c8.engineVersion = 0;
    local_7c8.apiVersion = 0;
    local_7c8.pApplicationName = (char *)0x0;
    local_7c8.applicationVersion = 0;
    local_7c8._28_4_ = 0;
    local_7c8._0_8_ = 0;
    local_7c8.pNext = (void *)0x0;
    local_798.enabledExtensionCount = 0;
    local_798._52_4_ = 0;
    local_798.ppEnabledExtensionNames = (char **)0x0;
    local_798.enabledLayerCount = 0;
    local_798._36_4_ = 0;
    local_798.ppEnabledLayerNames = (char **)0x0;
    local_798.flags = 0;
    local_798._20_4_ = 0;
    local_798.pApplicationInfo = (VkApplicationInfo *)0x0;
    local_798.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_798._4_4_ = 0;
    local_798.pNext = (void *)0x0;
    gladLoadVulkanUserPtr((VkPhysicalDevice)0x0,glad_vulkan_callback,(void *)0x0);
    uVar9 = 0x400000;
    if (glad_vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) {
      VVar11 = (*glad_vkEnumerateInstanceVersion)(&local_750.apiVersion);
      uVar9 = 0x400000;
      if (VVar11 == VK_SUCCESS) {
        uVar9 = local_750.apiVersion;
      }
    }
    printf("Vulkan loader API version: %i.%i\n",(ulong)(uVar9 >> 0x16),(ulong)(uVar9 >> 0xc & 0x3ff)
          );
    ppcVar13 = glfwGetRequiredInstanceExtensions(&local_7f8);
    printf("Vulkan required instance extensions:");
    if (ppcVar13 == (char **)0x0) {
      puts(" missing");
    }
    else {
      if (local_7f8 != 0) {
        uVar17 = 0;
        do {
          printf(" %s");
          uVar17 = uVar17 + 1;
        } while (uVar17 < local_7f8);
      }
      putchar(10);
      iVar7 = (int)local_818;
    }
    if (bVar2) {
      list_vulkan_instance_extensions();
    }
    if (iVar7 != 0) {
      list_vulkan_instance_layers();
    }
    local_7c8._0_8_ = local_7c8._0_8_ & 0xffffffff00000000;
    local_7c8.pApplicationName = "glfwinfo";
    local_7c8.applicationVersion = 0xc03004;
    local_7c8._40_8_ =
         CONCAT44((uint)(0x400fff < uVar9) << 0xc,local_7c8.engineVersion) | 0x40000000000000;
    local_798.sType = 1;
    local_798.pApplicationInfo = &local_7c8;
    local_798.enabledExtensionCount = local_7f8;
    local_798.ppEnabledExtensionNames = ppcVar13;
    VVar11 = (*glad_vkCreateInstance)
                       (&local_798,(VkAllocationCallbacks *)0x0,(VkInstance *)&local_808);
    if (VVar11 == VK_SUCCESS) {
      gladLoadVulkanUserPtr
                ((VkPhysicalDevice)0x0,glad_vulkan_callback,
                 (void *)CONCAT44(local_808._4_4_,(uint)local_808));
      VVar11 = (*glad_vkEnumeratePhysicalDevices)
                         ((VkInstance)CONCAT44(local_808._4_4_,(uint)local_808),&local_7fc,
                          (VkPhysicalDevice *)0x0);
      if (VVar11 == VK_SUCCESS) {
        __ptr = (VkPhysicalDevice *)calloc((ulong)local_7fc,8);
        VVar11 = (*glad_vkEnumeratePhysicalDevices)
                           ((VkInstance)CONCAT44(local_808._4_4_,(uint)local_808),&local_7fc,__ptr);
        if (VVar11 == VK_SUCCESS) {
          if (local_7fc != 0) {
            uVar17 = 0;
            uVar19 = local_818;
            local_7d8 = __ptr;
            do {
              (*glad_vkGetPhysicalDeviceProperties)(__ptr[uVar17],&local_750);
              pcVar15 = "unknown";
              if ((ulong)local_750.deviceType < 5) {
                pcVar15 = &DAT_001350d8 + *(int *)(&DAT_001350d8 + (ulong)local_750.deviceType * 4);
              }
              printf("Vulkan %s device: \"%s\" API version %i.%i\n",pcVar15,local_750.deviceName,
                     (ulong)(local_750.apiVersion >> 0x16),
                     (ulong)(local_750.apiVersion >> 0xc & 0x3ff));
              if (bVar2) {
                pVVar1 = __ptr[uVar17];
                puts("Vulkan device extensions:");
                VVar11 = (*glad_vkEnumerateDeviceExtensionProperties)
                                   (pVVar1,(char *)0x0,&local_81c,(VkExtensionProperties *)0x0);
                if (VVar11 == VK_SUCCESS) {
                  local_810 = (VkExtensionProperties *)calloc((ulong)local_81c,0x104);
                  VVar11 = (*glad_vkEnumerateDeviceExtensionProperties)
                                     (pVVar1,(char *)0x0,&local_81c,local_810);
                  if ((VVar11 == VK_SUCCESS) && (local_81c != 0)) {
                    uVar14 = 0;
                    pVVar16 = local_810;
                    do {
                      printf(" %s (v%u)\n",pVVar16,(ulong)pVVar16->specVersion);
                      uVar14 = uVar14 + 1;
                      pVVar16 = pVVar16 + 1;
                    } while (uVar14 < local_81c);
                  }
                  free(local_810);
                  uVar19 = local_818;
                }
              }
              if ((int)uVar19 != 0) {
                pVVar1 = __ptr[uVar17];
                puts("Vulkan device layers:");
                VVar11 = (*glad_vkEnumerateDeviceLayerProperties)
                                   (pVVar1,&local_81c,(VkLayerProperties *)0x0);
                if (VVar11 == VK_SUCCESS) {
                  __ptr_00 = (VkLayerProperties *)calloc((ulong)local_81c,0x208);
                  VVar11 = (*glad_vkEnumerateDeviceLayerProperties)(pVVar1,&local_81c,__ptr_00);
                  if ((VVar11 == VK_SUCCESS) && (local_81c != 0)) {
                    pcVar15 = __ptr_00->description;
                    uVar14 = 0;
                    do {
                      printf(" %s (v%u) \"%s\"\n",(VkLayerProperties *)(pcVar15 + -0x108),
                             (ulong)(*(uint *)(pcVar15 + -8) >> 0x16),pcVar15);
                      uVar14 = uVar14 + 1;
                      pcVar15 = pcVar15 + 0x208;
                    } while (uVar14 < local_81c);
                  }
                  free(__ptr_00);
                  __ptr = local_7d8;
                  uVar19 = local_818;
                }
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < local_7fc);
          }
          free(__ptr);
          (*glad_vkDestroyInstance)
                    ((VkInstance)CONCAT44(local_808._4_4_,(uint)local_808),
                     (VkAllocationCallbacks *)0x0);
          goto LAB_001198e3;
        }
        free(__ptr);
      }
      (*glad_vkDestroyInstance)
                ((VkInstance)CONCAT44(local_808._4_4_,(uint)local_808),(VkAllocationCallbacks *)0x0)
      ;
    }
  }
  glfwTerminate();
  goto LAB_001191dd;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, client, major, minor, revision, profile;
    GLint redbits, greenbits, bluebits, alphabits, depthbits, stencilbits;
    int list_extensions = GLFW_FALSE, list_layers = GLFW_FALSE;
    GLenum error;
    GLFWwindow* window;

    enum { CLIENT, CONTEXT, BEHAVIOR, DEBUG_CONTEXT, FORWARD, HELP,
           EXTENSIONS, LAYERS,
           MAJOR, MINOR, PROFILE, ROBUSTNESS, VERSION,
           REDBITS, GREENBITS, BLUEBITS, ALPHABITS, DEPTHBITS, STENCILBITS,
           ACCUMREDBITS, ACCUMGREENBITS, ACCUMBLUEBITS, ACCUMALPHABITS,
           AUXBUFFERS, SAMPLES, STEREO, SRGB, SINGLEBUFFER, NOERROR_SRSLY,
           GRAPHICS_SWITCHING };
    const struct option options[] =
    {
        { "behavior",           1, NULL, BEHAVIOR },
        { "client-api",         1, NULL, CLIENT },
        { "context-api",        1, NULL, CONTEXT },
        { "debug",              0, NULL, DEBUG_CONTEXT },
        { "forward",            0, NULL, FORWARD },
        { "help",               0, NULL, HELP },
        { "list-extensions",    0, NULL, EXTENSIONS },
        { "list-layers",        0, NULL, LAYERS },
        { "major",              1, NULL, MAJOR },
        { "minor",              1, NULL, MINOR },
        { "profile",            1, NULL, PROFILE },
        { "robustness",         1, NULL, ROBUSTNESS },
        { "version",            0, NULL, VERSION },
        { "red-bits",           1, NULL, REDBITS },
        { "green-bits",         1, NULL, GREENBITS },
        { "blue-bits",          1, NULL, BLUEBITS },
        { "alpha-bits",         1, NULL, ALPHABITS },
        { "depth-bits",         1, NULL, DEPTHBITS },
        { "stencil-bits",       1, NULL, STENCILBITS },
        { "accum-red-bits",     1, NULL, ACCUMREDBITS },
        { "accum-green-bits",   1, NULL, ACCUMGREENBITS },
        { "accum-blue-bits",    1, NULL, ACCUMBLUEBITS },
        { "accum-alpha-bits",   1, NULL, ACCUMALPHABITS },
        { "aux-buffers",        1, NULL, AUXBUFFERS },
        { "samples",            1, NULL, SAMPLES },
        { "stereo",             0, NULL, STEREO },
        { "srgb",               0, NULL, SRGB },
        { "singlebuffer",       0, NULL, SINGLEBUFFER },
        { "no-error",           0, NULL, NOERROR_SRSLY },
        { "graphics-switching", 0, NULL, GRAPHICS_SWITCHING },
        { NULL, 0, NULL, 0 }
    };

    // Initialize GLFW and create window

    if (!valid_version())
        exit(EXIT_FAILURE);

    glfwSetErrorCallback(error_callback);

    glfwInitHint(GLFW_COCOA_MENUBAR, GLFW_FALSE);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt_long(argc, argv, "a:b:c:dfhlm:n:p:s:v", options, NULL)) != -1)
    {
        switch (ch)
        {
            case 'a':
            case CLIENT:
                if (strcasecmp(optarg, API_NAME_OPENGL) == 0)
                    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API);
                else if (strcasecmp(optarg, API_NAME_OPENGL_ES) == 0)
                    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'b':
            case BEHAVIOR:
                if (strcasecmp(optarg, BEHAVIOR_NAME_NONE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR,
                                   GLFW_RELEASE_BEHAVIOR_NONE);
                }
                else if (strcasecmp(optarg, BEHAVIOR_NAME_FLUSH) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR,
                                   GLFW_RELEASE_BEHAVIOR_FLUSH);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'c':
            case CONTEXT:
                if (strcasecmp(optarg, API_NAME_NATIVE) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_NATIVE_CONTEXT_API);
                else if (strcasecmp(optarg, API_NAME_EGL) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
                else if (strcasecmp(optarg, API_NAME_OSMESA) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_OSMESA_CONTEXT_API);
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'd':
            case DEBUG_CONTEXT:
                glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE);
                break;
            case 'f':
            case FORWARD:
                glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);
                break;
            case 'h':
            case HELP:
                usage();
                exit(EXIT_SUCCESS);
            case 'l':
            case EXTENSIONS:
                list_extensions = GLFW_TRUE;
                break;
            case LAYERS:
                list_layers = GLFW_TRUE;
                break;
            case 'm':
            case MAJOR:
                glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, atoi(optarg));
                break;
            case 'n':
            case MINOR:
                glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, atoi(optarg));
                break;
            case 'p':
            case PROFILE:
                if (strcasecmp(optarg, PROFILE_NAME_CORE) == 0)
                {
                    glfwWindowHint(GLFW_OPENGL_PROFILE,
                                   GLFW_OPENGL_CORE_PROFILE);
                }
                else if (strcasecmp(optarg, PROFILE_NAME_COMPAT) == 0)
                {
                    glfwWindowHint(GLFW_OPENGL_PROFILE,
                                   GLFW_OPENGL_COMPAT_PROFILE);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 's':
            case ROBUSTNESS:
                if (strcasecmp(optarg, STRATEGY_NAME_NONE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS,
                                   GLFW_NO_RESET_NOTIFICATION);
                }
                else if (strcasecmp(optarg, STRATEGY_NAME_LOSE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS,
                                   GLFW_LOSE_CONTEXT_ON_RESET);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'v':
            case VERSION:
                print_version();
                exit(EXIT_SUCCESS);
            case REDBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_RED_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_RED_BITS, atoi(optarg));
                break;
            case GREENBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_GREEN_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_GREEN_BITS, atoi(optarg));
                break;
            case BLUEBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_BLUE_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_BLUE_BITS, atoi(optarg));
                break;
            case ALPHABITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ALPHA_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ALPHA_BITS, atoi(optarg));
                break;
            case DEPTHBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_DEPTH_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_DEPTH_BITS, atoi(optarg));
                break;
            case STENCILBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_STENCIL_BITS, atoi(optarg));
                break;
            case ACCUMREDBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_RED_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_RED_BITS, atoi(optarg));
                break;
            case ACCUMGREENBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, atoi(optarg));
                break;
            case ACCUMBLUEBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, atoi(optarg));
                break;
            case ACCUMALPHABITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, atoi(optarg));
                break;
            case AUXBUFFERS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_AUX_BUFFERS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_AUX_BUFFERS, atoi(optarg));
                break;
            case SAMPLES:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_SAMPLES, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_SAMPLES, atoi(optarg));
                break;
            case STEREO:
                glfwWindowHint(GLFW_STEREO, GLFW_TRUE);
                break;
            case SRGB:
                glfwWindowHint(GLFW_SRGB_CAPABLE, GLFW_TRUE);
                break;
            case SINGLEBUFFER:
                glfwWindowHint(GLFW_DOUBLEBUFFER, GLFW_FALSE);
                break;
            case NOERROR_SRSLY:
                glfwWindowHint(GLFW_CONTEXT_NO_ERROR, GLFW_TRUE);
                break;
            case GRAPHICS_SWITCHING:
                glfwWindowHint(GLFW_COCOA_GRAPHICS_SWITCHING, GLFW_TRUE);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    print_version();

    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    window = glfwCreateWindow(200, 200, "Version", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    error = glGetError();
    if (error != GL_NO_ERROR)
        printf("*** OpenGL error after make current: 0x%08x ***\n", error);

    // Report client API version

    client = glfwGetWindowAttrib(window, GLFW_CLIENT_API);
    major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
    minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
    revision = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);
    profile = glfwGetWindowAttrib(window, GLFW_OPENGL_PROFILE);

    printf("%s context version string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_VERSION));

    printf("%s context version parsed by GLFW: %u.%u.%u\n",
           get_api_name(client),
           major, minor, revision);

    // Report client API context properties

    if (client == GLFW_OPENGL_API)
    {
        if (major >= 3)
        {
            GLint flags;

            glGetIntegerv(GL_CONTEXT_FLAGS, &flags);
            printf("%s context flags (0x%08x):", get_api_name(client), flags);

            if (flags & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT)
                printf(" forward-compatible");
            if (flags & 2/*GL_CONTEXT_FLAG_DEBUG_BIT*/)
                printf(" debug");
            if (flags & GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT_ARB)
                printf(" robustness");
            if (flags & 8/*GL_CONTEXT_FLAG_NO_ERROR_BIT_KHR*/)
                printf(" no-error");
            putchar('\n');

            printf("%s context flags parsed by GLFW:", get_api_name(client));

            if (glfwGetWindowAttrib(window, GLFW_OPENGL_FORWARD_COMPAT))
                printf(" forward-compatible");
            if (glfwGetWindowAttrib(window, GLFW_OPENGL_DEBUG_CONTEXT))
                printf(" debug");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS) == GLFW_LOSE_CONTEXT_ON_RESET)
                printf(" robustness");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_NO_ERROR))
                printf(" no-error");
            putchar('\n');
        }

        if (major >= 4 || (major == 3 && minor >= 2))
        {
            GLint mask;
            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &mask);

            printf("%s profile mask (0x%08x): %s\n",
                   get_api_name(client),
                   mask,
                   get_profile_name_gl(mask));

            printf("%s profile mask parsed by GLFW: %s\n",
                   get_api_name(client),
                   get_profile_name_glfw(profile));
        }

        if (GLAD_GL_ARB_robustness)
        {
            const int robustness = glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS);
            GLint strategy;
            glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY_ARB, &strategy);

            printf("%s robustness strategy (0x%08x): %s\n",
                   get_api_name(client),
                   strategy,
                   get_strategy_name_gl(strategy));

            printf("%s robustness strategy parsed by GLFW: %s\n",
                   get_api_name(client),
                   get_strategy_name_glfw(robustness));
        }
    }

    printf("%s context renderer string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_RENDERER));
    printf("%s context vendor string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_VENDOR));

    if (major >= 2)
    {
        printf("%s context shading language version: \"%s\"\n",
               get_api_name(client),
               glGetString(GL_SHADING_LANGUAGE_VERSION));
    }

    printf("%s framebuffer:\n", get_api_name(client));

    if (client == GLFW_OPENGL_API && profile == GLFW_OPENGL_CORE_PROFILE)
    {
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
                                              &redbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
                                              &greenbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
                                              &bluebits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
                                              &alphabits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_DEPTH,
                                              GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
                                              &depthbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_STENCIL,
                                              GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
                                              &stencilbits);
    }
    else
    {
        glGetIntegerv(GL_RED_BITS, &redbits);
        glGetIntegerv(GL_GREEN_BITS, &greenbits);
        glGetIntegerv(GL_BLUE_BITS, &bluebits);
        glGetIntegerv(GL_ALPHA_BITS, &alphabits);
        glGetIntegerv(GL_DEPTH_BITS, &depthbits);
        glGetIntegerv(GL_STENCIL_BITS, &stencilbits);
    }

    printf(" red: %u green: %u blue: %u alpha: %u depth: %u stencil: %u\n",
           redbits, greenbits, bluebits, alphabits, depthbits, stencilbits);

    if (client == GLFW_OPENGL_ES_API ||
        GLAD_GL_ARB_multisample ||
        major > 1 || minor >= 3)
    {
        GLint samples, samplebuffers;
        glGetIntegerv(GL_SAMPLES, &samples);
        glGetIntegerv(GL_SAMPLE_BUFFERS, &samplebuffers);

        printf(" samples: %u sample buffers: %u\n", samples, samplebuffers);
    }

    if (client == GLFW_OPENGL_API && profile != GLFW_OPENGL_CORE_PROFILE)
    {
        GLint accumredbits, accumgreenbits, accumbluebits, accumalphabits;
        GLint auxbuffers;

        glGetIntegerv(GL_ACCUM_RED_BITS, &accumredbits);
        glGetIntegerv(GL_ACCUM_GREEN_BITS, &accumgreenbits);
        glGetIntegerv(GL_ACCUM_BLUE_BITS, &accumbluebits);
        glGetIntegerv(GL_ACCUM_ALPHA_BITS, &accumalphabits);
        glGetIntegerv(GL_AUX_BUFFERS, &auxbuffers);

        printf(" accum red: %u accum green: %u accum blue: %u accum alpha: %u aux buffers: %u\n",
               accumredbits, accumgreenbits, accumbluebits, accumalphabits, auxbuffers);
    }

    if (list_extensions)
        list_context_extensions(client, major, minor);

    printf("Vulkan loader: %s\n",
           glfwVulkanSupported() ? "available" : "missing");

    if (glfwVulkanSupported())
    {
        uint32_t loader_version = VK_API_VERSION_1_0;
        uint32_t i, re_count, pd_count;
        const char** re;
        VkApplicationInfo ai = {0};
        VkInstanceCreateInfo ici = {0};
        VkInstance instance;
        VkPhysicalDevice* pd;

        gladLoadVulkanUserPtr(NULL, glad_vulkan_callback, NULL);

        if (vkEnumerateInstanceVersion)
        {
            uint32_t version;
            if (vkEnumerateInstanceVersion(&version) == VK_SUCCESS)
                loader_version = version;
        }

        printf("Vulkan loader API version: %i.%i\n",
               VK_VERSION_MAJOR(loader_version),
               VK_VERSION_MINOR(loader_version));

        re = glfwGetRequiredInstanceExtensions(&re_count);

        printf("Vulkan required instance extensions:");
        if (re)
        {
            for (i = 0;  i < re_count;  i++)
                printf(" %s", re[i]);
            putchar('\n');
        }
        else
            printf(" missing\n");

        if (list_extensions)
            list_vulkan_instance_extensions();

        if (list_layers)
            list_vulkan_instance_layers();

        ai.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        ai.pApplicationName = "glfwinfo";
        ai.applicationVersion = VK_MAKE_VERSION(GLFW_VERSION_MAJOR,
                                                GLFW_VERSION_MINOR,
                                                GLFW_VERSION_REVISION);

        if (loader_version >= VK_API_VERSION_1_1)
            ai.apiVersion = VK_API_VERSION_1_1;
        else
            ai.apiVersion = VK_API_VERSION_1_0;

        ici.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
        ici.pApplicationInfo = &ai;
        ici.enabledExtensionCount = re_count;
        ici.ppEnabledExtensionNames = re;

        if (vkCreateInstance(&ici, NULL, &instance) != VK_SUCCESS)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        gladLoadVulkanUserPtr(NULL, glad_vulkan_callback, instance);

        if (vkEnumeratePhysicalDevices(instance, &pd_count, NULL) != VK_SUCCESS)
        {
            vkDestroyInstance(instance, NULL);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        pd = calloc(pd_count, sizeof(VkPhysicalDevice));

        if (vkEnumeratePhysicalDevices(instance, &pd_count, pd) != VK_SUCCESS)
        {
            free(pd);
            vkDestroyInstance(instance, NULL);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        for (i = 0;  i < pd_count;  i++)
        {
            VkPhysicalDeviceProperties pdp;

            vkGetPhysicalDeviceProperties(pd[i], &pdp);

            printf("Vulkan %s device: \"%s\" API version %i.%i\n",
                   get_device_type_name(pdp.deviceType),
                   pdp.deviceName,
                   VK_VERSION_MAJOR(pdp.apiVersion),
                   VK_VERSION_MINOR(pdp.apiVersion));

            if (list_extensions)
                list_vulkan_device_extensions(instance, pd[i]);

            if (list_layers)
                list_vulkan_device_layers(instance, pd[i]);
        }

        free(pd);
        vkDestroyInstance(instance, NULL);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}